

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

void __thiscall
btAlignedObjectArray<btAlignedObjectArray<int>_>::resize
          (btAlignedObjectArray<btAlignedObjectArray<int>_> *this,int newsize,
          btAlignedObjectArray<int> *fillData)

{
  int iVar1;
  btAlignedObjectArray<int> *pbVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = this->m_size;
  if (newsize < iVar3) {
    lVar4 = (long)newsize << 5;
    iVar3 = iVar3 - newsize;
    do {
      btAlignedObjectArray<int>::~btAlignedObjectArray
                ((btAlignedObjectArray<int> *)(&this->m_data->field_0x0 + lVar4));
      lVar4 = lVar4 + 0x20;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  else {
    if ((iVar3 < newsize) && (this->m_capacity < newsize)) {
      if (newsize == 0) {
        pbVar2 = (btAlignedObjectArray<int> *)0x0;
      }
      else {
        pbVar2 = (btAlignedObjectArray<int> *)btAlignedAllocInternal((long)newsize << 5,0x10);
      }
      iVar1 = this->m_size;
      if (0 < (long)iVar1) {
        lVar4 = 0;
        do {
          btAlignedObjectArray<int>::btAlignedObjectArray
                    ((btAlignedObjectArray<int> *)((long)&pbVar2->field_0x0 + lVar4),
                     (btAlignedObjectArray<int> *)(&this->m_data->field_0x0 + lVar4));
          lVar4 = lVar4 + 0x20;
        } while ((long)iVar1 * 0x20 != lVar4);
      }
      iVar1 = this->m_size;
      if (0 < (long)iVar1) {
        lVar4 = 0;
        do {
          btAlignedObjectArray<int>::~btAlignedObjectArray
                    ((btAlignedObjectArray<int> *)(&this->m_data->field_0x0 + lVar4));
          lVar4 = lVar4 + 0x20;
        } while ((long)iVar1 * 0x20 != lVar4);
      }
      if (this->m_data != (btAlignedObjectArray<int> *)0x0) {
        if (this->m_ownsMemory == true) {
          btAlignedFreeInternal(this->m_data);
        }
        this->m_data = (btAlignedObjectArray<int> *)0x0;
      }
      this->m_ownsMemory = true;
      this->m_data = pbVar2;
      this->m_capacity = newsize;
    }
    if (iVar3 < newsize) {
      lVar4 = (long)iVar3 << 5;
      iVar3 = newsize - iVar3;
      do {
        btAlignedObjectArray<int>::btAlignedObjectArray
                  ((btAlignedObjectArray<int> *)(&this->m_data->field_0x0 + lVar4),fillData);
        lVar4 = lVar4 + 0x20;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}